

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

SRes crnlib::LzmaEncode(Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,CLzmaEncProps *props,
                       Byte *propsEncoded,SizeT *propsSize,int writeEndMark,
                       ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  SRes SVar2;
  CLzmaEnc *p_00;
  CLzmaEnc *p;
  ISeqOutStream local_50;
  Byte *local_48;
  SizeT local_40;
  int local_38;
  
  p_00 = (CLzmaEnc *)(*alloc->Alloc)(alloc,0x46a88);
  if (p_00 == (CLzmaEnc *)0x0) {
    SVar1 = 2;
  }
  else {
    LzmaEnc_Construct(p_00);
    SVar1 = LzmaEnc_SetProps(p_00,props);
    if ((SVar1 == 0) && (SVar1 = LzmaEnc_WriteProperties(p_00,propsEncoded,propsSize), SVar1 == 0))
    {
      (p_00->seqBufInStream).funcTable.Read = MyRead;
      (p_00->seqBufInStream).data = src;
      (p_00->seqBufInStream).rem = srcLen;
      local_50.Write = MyWrite;
      local_40 = *destLen;
      local_38 = 0;
      p_00->writeEndMark = writeEndMark;
      local_48 = dest;
      SVar2 = LzmaEnc_Encode(p_00,&local_50,&(p_00->seqBufInStream).funcTable,progress,alloc,
                             allocBig);
      *destLen = *destLen - local_40;
      SVar1 = 7;
      if (local_38 == 0) {
        SVar1 = SVar2;
      }
    }
    LzmaEnc_Destruct(p_00,alloc,allocBig);
    (*alloc->Free)(alloc,p_00);
  }
  return SVar1;
}

Assistant:

SRes LzmaEncode(Byte* dest, SizeT* destLen, const Byte* src, SizeT srcLen,
                const CLzmaEncProps* props, Byte* propsEncoded, SizeT* propsSize, int writeEndMark,
                ICompressProgress* progress, ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)LzmaEnc_Create(alloc);
  SRes res;
  if (p == 0)
    return SZ_ERROR_MEM;

  res = LzmaEnc_SetProps(p, props);
  if (res == SZ_OK) {
    res = LzmaEnc_WriteProperties(p, propsEncoded, propsSize);
    if (res == SZ_OK)
      res = LzmaEnc_MemEncode(p, dest, destLen, src, srcLen,
                              writeEndMark, progress, alloc, allocBig);
  }

  LzmaEnc_Destroy(p, alloc, allocBig);
  return res;
}